

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::set_last_prop(CVmImageLoader *this,vm_prop_id_t last_prop)

{
  vm_val_t new_cont;
  vm_val_t new_val;
  vm_val_t idx_val;
  vm_val_t local_30;
  vm_val_t local_20;
  vm_val_t local_10;
  
  local_10.typ = VM_INT;
  local_10.val.obj = 1;
  local_20.typ = VM_PROP;
  local_20.val.prop = G_predef_X.last_prop;
  CVmObject::set_index_val
            ((CVmObject *)
             (G_obj_table_X.pages_[G_predef_X.last_prop_obj >> 0xc] +
             (G_predef_X.last_prop_obj & 0xfff)),&local_30,G_predef_X.last_prop_obj,&local_10,
             &local_20);
  return;
}

Assistant:

void CVmImageLoader::set_last_prop(VMG_ vm_prop_id_t last_prop)
{
    /* get the LastPropObj vector */
    CVmObjVector *vec = (CVmObjVector *)vm_objp(vmg_ G_predef->last_prop_obj);

    /* 
     *   set up the values - the index is always 1, since the vector
     *   contains only one element; and the value contains the new last
     *   property ID 
     */
    vm_val_t idx_val, new_val;
    idx_val.set_int(1);
    new_val.set_propid(G_predef->last_prop);

    /* update the vector */
    vm_val_t new_cont;
    vec->set_index_val(vmg_ &new_cont, G_predef->last_prop_obj,
                       &idx_val, &new_val);
}